

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

string * flatbuffers::RemoveStringQuotes(string *__return_storage_ptr__,string *s)

{
  char cVar1;
  char *pcVar2;
  ulong uVar3;
  
  pcVar2 = (s->_M_dataplus)._M_p;
  uVar3 = s->_M_string_length;
  if ((1 < uVar3) &&
     (((cVar1 = *pcVar2, cVar1 == '\'' || (cVar1 == '\"')) && (cVar1 == pcVar2[uVar3 - 1])))) {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)s);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar2,pcVar2 + uVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string RemoveStringQuotes(const std::string &s) {
  auto ch = *s.c_str();
  return ((s.size() >= 2) && (ch == '\"' || ch == '\'') && (ch == s.back()))
             ? s.substr(1, s.length() - 2)
             : s;
}